

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void prvTidyDefineMutedMessage(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  tidyStrings tVar1;
  TidyMutedMessages *pTVar2;
  tidyStrings *ptVar3;
  tidyStrings message;
  TidyMutedMessages *list;
  ctmbstr name_local;
  TidyOptionImpl *opt_local;
  TidyDocImpl *doc_local;
  
  pTVar2 = &doc->muted;
  tVar1 = prvTidytidyErrorCodeFromKey(name);
  if ((tVar1 < ADDED_MISSING_CHARSET) || (XML_ID_SYNTAX < tVar1)) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x275,opt->name,name);
  }
  else {
    if (pTVar2->list == (tidyStrings *)0x0) {
      ptVar3 = (tidyStrings *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x28);
      pTVar2->list = ptVar3;
      *pTVar2->list = 0;
      (doc->muted).capacity = 10;
      (doc->muted).count = 0;
    }
    if ((doc->muted).capacity <= (doc->muted).count) {
      (doc->muted).capacity = (doc->muted).capacity << 1;
      ptVar3 = (tidyStrings *)realloc(pTVar2->list,(ulong)(doc->muted).capacity * 4 + 1);
      pTVar2->list = ptVar3;
    }
    pTVar2->list[(doc->muted).count] = tVar1;
    (doc->muted).count = (doc->muted).count + 1;
    pTVar2->list[(doc->muted).count] = 0;
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x278,name);
  }
  return;
}

Assistant:

void TY_(DefineMutedMessage)(TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name)
{
    enum { capacity = 10 };
    TidyMutedMessages *list = &(doc->muted);
    tidyStrings message = TY_(tidyErrorCodeFromKey)( name );

    if ( message <= REPORT_MESSAGE_FIRST || message >= REPORT_MESSAGE_LAST)
    {
        TY_(Report)( doc, NULL, NULL, STRING_ARGUMENT_BAD, opt->name, name );
        return;
    }

    if ( !list->list )
    {
        list->list = TidyAlloc(doc->allocator, sizeof(tidyStrings) * capacity );
        list->list[0] = 0;
        list->capacity = capacity;
        list->count = 0;
    }

    if ( list->count >= list->capacity )
    {
        list->capacity = list->capacity * 2;
        list->list = realloc( list->list, sizeof(tidyStrings) * list->capacity + 1 );
    }

    list->list[list->count] = message;
    list->count++;
    list->list[list->count] = 0;

    /* Must come *after* adding to the list, in case it's muted, too. */
    TY_(Report)( doc, NULL, NULL, STRING_MUTING_TYPE, name );
}